

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

int apply_aug(lys_node_augment *augment,unres_schema *unres)

{
  lyext_plugin *plVar1;
  lys_node *plVar2;
  int iVar3;
  lys_node *plVar4;
  lys_node *plVar5;
  LYS_NODE LVar6;
  lys_module *mod;
  ulong uVar7;
  uint clear;
  
  plVar4 = augment->target;
  if ((plVar4 == (lys_node *)0x0) || ((augment->flags & 1) == 0)) {
    __assert_fail("augment->target && (augment->flags & LYS_NOTAPPLIED)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x110f,"int apply_aug(struct lys_node_augment *, struct unres_schema *)");
  }
  if (augment->child != (lys_node *)0x0) {
    LVar6 = plVar4->nodetype;
    clear = 1;
    if ((LVar6 & (LYS_OUTPUT|LYS_INPUT|LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN) {
      do {
        if (LVar6 == LYS_EXT) {
          if (plVar4->padding[1] != '\x01') goto LAB_00163c7b;
          plVar4 = (lys_node *)plVar4->dsc;
LAB_00163c6c:
          if (plVar4->nodetype == LYS_AUGMENT) {
            plVar4 = plVar4->prev;
          }
        }
        else {
          plVar4 = plVar4->parent;
          if (plVar4 != (lys_node *)0x0) goto LAB_00163c6c;
LAB_00163c7b:
          plVar4 = (lys_node *)0x0;
        }
      } while ((plVar4 != (lys_node *)0x0) &&
              (LVar6 = plVar4->nodetype,
              (LVar6 & (LYS_OUTPUT|LYS_INPUT|LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN));
      clear = (uint)(plVar4 != (lys_node *)0x0);
    }
    for (plVar4 = augment->child; plVar4 != (lys_node *)0x0; plVar4 = plVar4->next) {
      iVar3 = inherit_config_flag(plVar4,augment->target->flags & 3,clear);
      if (iVar3 != 0) {
        return -1;
      }
    }
    plVar4 = augment->target;
    if (plVar4->ext_size != '\0') {
      uVar7 = 0;
      do {
        if (((plVar4->ext[uVar7] != (lys_ext_instance *)0x0) &&
            (plVar1 = plVar4->ext[uVar7]->def->plugin, plVar1 != (lyext_plugin *)0x0)) &&
           ((plVar1->flags & 1) != 0)) {
          plVar5 = (lys_node *)malloc(1);
          if (plVar5 == (lys_node *)0x0) {
            ly_log(augment->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "apply_aug");
            return -1;
          }
          *(char *)&plVar5->name = (char)uVar7;
          mod = augment->module;
          if (mod == (lys_module *)0x0) {
            mod = (lys_module *)0x0;
          }
          else if ((mod->field_0x40 & 1) != 0) {
            mod = (lys_module *)mod->data;
          }
          iVar3 = unres_schema_add_node(mod,unres,&plVar4->ext,UNRES_EXT_FINALIZE,plVar5);
          if (iVar3 == -1) {
            return -1;
          }
        }
        uVar7 = uVar7 + 1;
        plVar4 = augment->target;
      } while (uVar7 < plVar4->ext_size);
    }
    plVar5 = plVar4->child;
    if (plVar5 == (lys_node *)0x0) {
      plVar4->child = augment->child;
    }
    else {
      plVar4 = plVar5->prev;
      plVar2 = augment->child;
      plVar4->next = plVar2;
      plVar5->prev = plVar2->prev;
      plVar2->prev = plVar4;
    }
  }
  *(byte *)&augment->flags = (byte)augment->flags & 0xfe;
  return 0;
}

Assistant:

int
apply_aug(struct lys_node_augment *augment, struct unres_schema *unres)
{
    struct lys_node *child, *parent;
    int clear_config;
    unsigned int u;
    uint8_t *v;
    struct lys_ext_instance *ext;

    assert(augment->target && (augment->flags & LYS_NOTAPPLIED));

    if (!augment->child) {
        /* nothing to apply */
        goto success;
    }

    /* inherit config information from actual parent */
    for (parent = augment->target; parent && !(parent->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT | LYS_RPC)); parent = lys_parent(parent));
    clear_config = (parent) ? 1 : 0;
    LY_TREE_FOR(augment->child, child) {
        if (inherit_config_flag(child, augment->target->flags & LYS_CONFIG_MASK, clear_config)) {
            return -1;
        }
    }

    /* inherit extensions if any */
    for (u = 0; u < augment->target->ext_size; u++) {
        ext = augment->target->ext[u]; /* shortcut */
        if (ext && ext->def->plugin && (ext->def->plugin->flags & LYEXT_OPT_INHERIT)) {
            v = malloc(sizeof *v);
            LY_CHECK_ERR_RETURN(!v, LOGMEM(augment->module->ctx), -1);
            *v = u;
            if (unres_schema_add_node(lys_main_module(augment->module), unres, &augment->target->ext,
                    UNRES_EXT_FINALIZE, (struct lys_node *)v) == -1) {
                /* something really bad happend since the extension finalization is not actually
                 * being resolved while adding into unres, so something more serious with the unres
                 * list itself must happened */
                return -1;
            }
        }
    }

    /* reconnect augmenting data into the target - add them to the target child list */
    if (augment->target->child) {
        child = augment->target->child->prev;
        child->next = augment->child;
        augment->target->child->prev = augment->child->prev;
        augment->child->prev = child;
    } else {
        augment->target->child = augment->child;
    }

success:
    /* remove the flag about not applicability */
    augment->flags &= ~LYS_NOTAPPLIED;
    return EXIT_SUCCESS;
}